

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

FileContainer_ptr __thiscall
filesystemcollection::getbyname(filesystemcollection *this,string *name)

{
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  FileContainer_ptr FVar3;
  
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FileContainer>_>_>_>
                  *)name,in_RDX);
  if (iVar1._M_node == (_Base_ptr)&name->_M_string_length) {
    *(undefined8 *)&(this->_byname)._M_t._M_impl = 0;
    *(undefined8 *)&(this->_byname)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    std::__shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2));
    _Var2._M_pi = extraout_RDX_00;
  }
  FVar3.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  FVar3.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (FileContainer_ptr)FVar3.super___shared_ptr<FileContainer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

FileContainer_ptr getbyname(const std::string& name)
    {
        auto i= _byname.find(name);
        if (i==_byname.end())
            return FileContainer_ptr();
        return i->second;
    }